

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::generate_verilog_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top,SystemVerilogCodeGenOptions *options)

{
  _Rb_tree_header *p_Var1;
  pointer ppVar2;
  size_type sVar3;
  undefined1 local_e0 [8];
  pointer local_d8;
  undefined1 local_c8 [24];
  undefined8 *local_b0 [2];
  undefined8 local_a0 [2];
  undefined1 local_90;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  pointer local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_38;
  
  local_e0._0_2_ = *(undefined2 *)&(top->super_IRNode)._vptr_IRNode;
  if ((top->super_IRNode).fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    ppVar2 = (top->super_IRNode).fn_name_ln.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_d8 = (pointer)local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,ppVar2,
               (long)&(((top->super_IRNode).fn_name_ln.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->first)._M_dataplus._M_p +
               (long)ppVar2);
    local_c8._16_8_ = (top->super_IRNode).comment._M_dataplus._M_p;
    sVar3 = (top->super_IRNode).comment._M_string_length;
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,sVar3,
               (top->super_IRNode).comment.field_2._M_allocated_capacity + sVar3);
    local_90 = *(undefined1 *)
                &(top->super_IRNode).attributes_.
                 super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    generate_verilog_no_pkg_abi_cxx11_(__return_storage_ptr__,this,(Generator *)local_e0,options);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    if (local_d8 != (pointer)local_c8) {
      operator_delete(local_d8,(ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_c8._0_8_)->_M_dataplus)._M_p + 1));
    }
  }
  else {
    ppVar2 = (top->super_IRNode).fn_name_ln.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_88._0_2_ = local_e0._0_2_;
    local_80._M_p = (pointer)&local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,ppVar2,
               (long)&(((top->super_IRNode).fn_name_ln.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->first)._M_dataplus._M_p +
               (long)ppVar2);
    local_60 = (top->super_IRNode).comment._M_dataplus._M_p;
    sVar3 = (top->super_IRNode).comment._M_string_length;
    local_58._M_allocated_capacity = (size_type)&local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,sVar3,
               (top->super_IRNode).comment.field_2._M_allocated_capacity + sVar3);
    local_38 = *(undefined1 *)
                &(top->super_IRNode).attributes_.
                 super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    generate_verilog_pkg((Generator *)this,(SystemVerilogCodeGenOptions *)local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_allocated_capacity != &local_48) {
      operator_delete((void *)local_58._M_allocated_capacity,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != &local_70) {
      operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
    }
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
    ;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> generate_verilog(Generator* top,
                                                    SystemVerilogCodeGenOptions options) {
    if (options.package_name.empty()) {
        return generate_verilog_no_pkg(top, options);
    } else {
        generate_verilog_pkg(top, options);
        return {};
    }
}